

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

double get_min_cr(AV1LevelSpec *level_spec,int tier,int is_still_picture,int64_t decoded_sample_rate
                 )

{
  long lVar1;
  double dVar2;
  
  if (is_still_picture != 0) {
    return 0.8;
  }
  lVar1 = 0x40;
  if (tier != 0) {
    lVar1 = (ulong)(7 < level_spec->level) * 8 + 0x40;
  }
  dVar2 = ((double)decoded_sample_rate / (double)level_spec->max_display_rate) *
          *(double *)(&level_spec->level + lVar1);
  if (dVar2 <= 0.8) {
    dVar2 = 0.8;
  }
  return dVar2;
}

Assistant:

static double get_min_cr(const AV1LevelSpec *const level_spec, int tier,
                         int is_still_picture, int64_t decoded_sample_rate) {
  if (is_still_picture) return 0.8;
  if (level_spec->level < SEQ_LEVEL_4_0) tier = 0;
  const double min_cr_basis = tier ? level_spec->high_cr : level_spec->main_cr;
  const double speed_adj =
      (double)decoded_sample_rate / level_spec->max_display_rate;
  return AOMMAX(min_cr_basis * speed_adj, 0.8);
}